

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

void __thiscall
llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
printOptionDiff(parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this,Option *O,StringRef V,
               OptionValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *D,size_t GlobalWidth)

{
  bool bVar1;
  raw_ostream *prVar2;
  ulong __n;
  uint NumSpaces;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  
  __n = V.Length;
  basic_parser_impl::printOptionName((basic_parser_impl *)this,O,GlobalWidth);
  prVar2 = outs();
  Str.Length = 2;
  Str.Data = "= ";
  prVar2 = raw_ostream::operator<<(prVar2,Str);
  raw_ostream::operator<<(prVar2,V);
  NumSpaces = 0;
  if (V.Length < 8) {
    NumSpaces = 8 - (int)V.Length;
  }
  prVar2 = outs();
  prVar2 = raw_ostream::indent(prVar2,NumSpaces);
  Str_00.Length = 0xb;
  Str_00.Data = " (default: ";
  raw_ostream::operator<<(prVar2,Str_00);
  bVar1 = (D->
          super_OptionValueCopy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).Valid;
  prVar2 = outs();
  if (bVar1 == true) {
    if ((D->
        super_OptionValueCopy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).Valid == false) {
      __assert_fail("Valid && \"invalid option value\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/CommandLine.h"
                    ,0x1fc,
                    "const DataType &llvm::cl::OptionValueCopy<std::basic_string<char>>::getValue() const [DataType = std::basic_string<char>]"
                   );
    }
    raw_ostream::write(prVar2,(int)(D->
                                   super_OptionValueCopy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ).Value._M_dataplus._M_p,
                       (void *)(D->
                               super_OptionValueCopy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ).Value._M_string_length,__n);
  }
  else {
    Str_01.Length = 0xc;
    Str_01.Data = "*no default*";
    raw_ostream::operator<<(prVar2,Str_01);
  }
  prVar2 = outs();
  Str_02.Length = 2;
  Str_02.Data = ")\n";
  raw_ostream::operator<<(prVar2,Str_02);
  return;
}

Assistant:

void parser<std::string>::printOptionDiff(const Option &O, StringRef V,
                                          const OptionValue<std::string> &D,
                                          size_t GlobalWidth) const {
  printOptionName(O, GlobalWidth);
  outs() << "= " << V;
  size_t NumSpaces = MaxOptWidth > V.size() ? MaxOptWidth - V.size() : 0;
  outs().indent(NumSpaces) << " (default: ";
  if (D.hasValue())
    outs() << D.getValue();
  else
    outs() << "*no default*";
  outs() << ")\n";
}